

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall Cart::Cart(Cart *this,Buffer *rom,Variant variant)

{
  uchar x;
  pointer puVar1;
  pointer puVar2;
  void *pvVar3;
  CGB CVar4;
  runtime_error *this_00;
  byte bVar5;
  long lVar6;
  undefined8 *puVar7;
  pointer *ppuVar8;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_char> __l_00;
  allocator_type local_89;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70 [3];
  
  puVar1 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar7 = &DAT_0010dae8;
  ppuVar8 = (pointer *)local_70;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *ppuVar8 = (pointer)*puVar7;
    puVar7 = puVar7 + 1;
    ppuVar8 = ppuVar8 + 1;
  }
  __l._M_len = 9;
  __l._M_array = (iterator)local_70;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_88,__l,&local_89);
  ThrowUnlessContains<unsigned_long>((long)puVar2 - (long)puVar1,&local_88,"Invalid ROM size.");
  pvVar3 = (void *)CONCAT53(local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._3_5_,
                            CONCAT12(local_88.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                     local_88.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_2_));
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  x = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[0x143];
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0x8000;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = 0xc0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_70,__l_00,(allocator_type *)&local_89);
  ThrowUnlessContains<unsigned_char>(x,local_70,"Invalid cgb flag.");
  if (local_70[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  CVar4 = (CGB)(rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start[0x143];
  this->cgb = CVar4;
  ThrowUnless((variant == Guess || variant == CGB) || CVar4 != Required,"Variant requires CGB.");
  puVar1 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = puVar1[0x147] + 4;
  if ((0x22 < bVar5) || ((0x7e0fdb6ffU >> ((ulong)bVar5 & 0x3f) & 1) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid cart type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->mbc = *(MBC *)(&DAT_0010e190 + (ulong)bVar5 * 4);
  ThrowUnless(puVar1[0x148] < 9,"Invalid ROM size.");
  puVar1 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = puVar1[0x148];
  this->rom_size = (uint)bVar5;
  this->rom_bank_mask = (char)(2 << (bVar5 & 0x1f)) + 0xff;
  ThrowUnless(puVar1[0x149] < 6,"Invalid SRAM size.");
  bVar5 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[0x149];
  this->sram_size = (uint)bVar5;
  if (this->mbc == _2) {
    this->sram_bank_mask = '\0';
    this->sram_addr_mask = 0x1ff;
    return;
  }
  switch(bVar5) {
  case 0:
    this->sram_addr_mask = 0;
    this->sram_bank_mask = '\0';
    return;
  case 1:
    this->sram_bank_mask = '\0';
    this->sram_addr_mask = 0x7ff;
    return;
  case 2:
    this->sram_bank_mask = '\0';
    break;
  case 3:
    this->sram_bank_mask = '\x03';
    break;
  case 4:
    this->sram_bank_mask = '\x0f';
    break;
  case 5:
    this->sram_bank_mask = '\a';
    break;
  default:
    goto switchD_00106638_default;
  }
  this->sram_addr_mask = 0x1fff;
switchD_00106638_default:
  return;
}

Assistant:

Cart::Cart(const Buffer& rom, Variant variant) {
  ThrowUnlessContains(rom.size(),
                      {1u << 15, 1u << 16, 1u << 17, 1u << 18, 1u << 19,
                       1u << 20, 1u << 21, 1u << 22, 1u << 23},
                      "Invalid ROM size.");

  ThrowUnlessContains(rom[0x143], {0, 0x80, 0xc0}, "Invalid cgb flag.");
  cgb = static_cast<CGB>(rom[0x143]);

  ThrowUnless(cgb != CGB::Required || variant == Variant::CGB ||
                  variant == Variant::Guess,
              "Variant requires CGB.");

  switch (rom[0x147]) {
    case 0: case 8: case 9: case 252: mbc = MBC::None; break;
    case 1: case 2: case 3: mbc = MBC::_1; break;
    case 5: case 6: mbc = MBC::_2; break;
    case 11: case 12: case 14: mbc = MBC::MMM01; break;
    case 15: case 16: case 17: case 18: case 19: mbc = MBC::_3; break;
    case 25: case 26: case 27: case 28: case 29: case 30: mbc = MBC::_5; break;
    case 253: mbc = MBC::TAMA5; break;
    case 254: mbc = MBC::HUC3; break;
    case 255: mbc = MBC::HUC1; break;
    default: throw Error("Invalid cart type");
  }

  ThrowUnless(rom[0x148] <= 8, "Invalid ROM size.");
  rom_size = static_cast<ROMSize>(rom[0x148]);
  rom_bank_mask = (2 << (u8)rom_size) - 1;

  ThrowUnless(rom[0x149] <= 5, "Invalid SRAM size.");
  sram_size = static_cast<SRAMSize>(rom[0x149]);
  if (mbc == MBC::_2) {
    sram_bank_mask = 0;
    sram_addr_mask = 0x1ff;
  } else {
    switch (sram_size) {
      case SRAMSize::None: sram_bank_mask = sram_addr_mask = 0; break;
      case SRAMSize::_2k: sram_bank_mask = 0; sram_addr_mask = 0x7ff; break;
      case SRAMSize::_8k: sram_bank_mask = 0; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_32k: sram_bank_mask = 3; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_128k: sram_bank_mask = 15; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_64k: sram_bank_mask = 7; sram_addr_mask = 0x1fff; break;
    }
  }
}